

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions.cpp
# Opt level: O1

bool chip8::instructions::ld_reg_k(registers *regs,instr_t instr)

{
  keyboard_state kVar1;
  size_t idx;
  ulong uVar2;
  
  kVar1 = get_keyboard_state();
  if (kVar1.super__Base_bitset<1UL>._M_w != 0) {
    uVar2 = 0;
    do {
      if (((ulong)kVar1.super__Base_bitset<1UL>._M_w >> (uVar2 & 0x3f) & 1) != 0) goto LAB_0010a419;
      uVar2 = uVar2 + 1;
    } while (uVar2 != 0x10);
    uVar2 = 0;
LAB_0010a419:
    (regs->v)._M_elems[(ushort)instr._M_elems & 0xf] = (byte)uVar2;
  }
  return kVar1.super__Base_bitset<1UL>._M_w != 0;
}

Assistant:

bool instructions::ld_reg_k(chip8::registers& regs, instr_t instr) noexcept
{
	const auto kbd_state = chip8::get_keyboard_state();
	if (!kbd_state.count())
		return false;

	auto pressed_idx = std::byte{0};
	for (size_t idx = 0; idx < kbd_state.size(); ++idx)
	{
		if (kbd_state[idx])
		{
			pressed_idx = std::byte(idx);
			break;
		}
	}

	regs.v[instructions::get_lower_nibble<size_t>(instr[0])] = pressed_idx;
	return true;
}